

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_restricted(Integer g_a,Integer *list,Integer size)

{
  long lVar1;
  C_Integer *pCVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer nproc;
  Integer has_data;
  Integer p_handle;
  Integer me;
  Integer id;
  Integer ig;
  Integer i;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  Integer local_50;
  C_Integer local_48;
  long local_40;
  Integer local_38;
  C_Integer local_30;
  long local_20;
  
  local_30 = 0;
  lVar1 = in_RDI + 1000;
  GA[lVar1].num_rstrctd = in_RDX;
  pCVar2 = (C_Integer *)malloc(in_RDX << 3);
  GA[lVar1].rstrctd_list = pCVar2;
  pCVar2 = (C_Integer *)malloc(GAnproc << 3);
  GA[lVar1].rank_rstrctd = pCVar2;
  local_40 = (long)GA[lVar1].p_handle;
  if (local_40 == -2) {
    local_40 = pnga_pgroup_get_default();
  }
  if (local_40 < 1) {
    local_38 = GAme;
    local_50 = GAnproc;
  }
  else {
    local_38 = (Integer)PGRP_LIST[local_40].map_proc_list[GAme];
    local_50 = (Integer)PGRP_LIST[local_40].map_nproc;
  }
  local_48 = 0;
  for (local_20 = 0; local_20 < GAnproc; local_20 = local_20 + 1) {
    GA[lVar1].rank_rstrctd[local_20] = -1;
  }
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    GA[lVar1].rstrctd_list[local_20] = *(C_Integer *)(in_RSI + local_20 * 8);
    if (local_38 == *(long *)(in_RSI + local_20 * 8)) {
      local_48 = 1;
      local_30 = local_20;
    }
    if ((*(long *)(in_RSI + local_20 * 8) < 0) || (local_50 <= *(long *)(in_RSI + local_20 * 8))) {
      pnga_error(in_stack_00000150,in_stack_00000148);
    }
    GA[lVar1].rank_rstrctd[*(long *)(in_RSI + local_20 * 8)] = local_20;
  }
  GA[lVar1].has_data = local_48;
  GA[lVar1].rstrctd_id = local_30;
  return;
}

Assistant:

void pnga_set_restricted(Integer g_a, Integer *list, Integer size)
{
  Integer i, ig, id=0, me, p_handle, has_data, nproc;
  Integer ga_handle = g_a + GA_OFFSET;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc(size*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  for (i=0; i<size; i++) {
    GA[ga_handle].rstrctd_list[i] = list[i];
    /* check if processor is in list */
    if (me == list[i]) {
      has_data = 1;
      id = i;
    }
    /* check if processor is in group */
    if (list[i] < 0 || list[i] >= nproc)
      pnga_error("Invalid processor in list",list[i]);
    ig = list[i];
    GA[ga_handle].rank_rstrctd[ig] = i;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}